

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_body(ModuleParseContext *this,BlockOrRecord *entry)

{
  pointer ppFVar1;
  Function *pFVar2;
  pointer pBVar3;
  pointer ppIVar4;
  bool bVar5;
  uint uVar6;
  pointer ppFVar7;
  FunctionType *this_00;
  Argument *arg;
  LoggingCallback p_Var8;
  void *pvVar9;
  pointer ppFVar10;
  BlockOrRecord *child;
  pointer entry_00;
  uint uVar11;
  Vector<Value_*> global_values;
  char buffer [4096];
  uint local_107c;
  Vector<Value_*> *local_1078;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_1070;
  Vector<BasicBlock_*> local_1058;
  Type *local_1038;
  undefined7 uStack_1030;
  undefined1 uStack_1029;
  undefined7 uStack_1028;
  char acStack_1021 [4081];
  
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_1070,&this->values);
  if (this->seen_first_function_body == false) {
    ppFVar1 = (this->functions_with_bodies).
              super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar7 = (this->functions_with_bodies).
              super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppFVar10 = ppFVar7 + -1;
    if (ppFVar1 < ppFVar10 && ppFVar1 != ppFVar7) {
      do {
        ppFVar7 = ppFVar1 + 1;
        pFVar2 = *ppFVar1;
        *ppFVar1 = *ppFVar10;
        *ppFVar10 = pFVar2;
        ppFVar10 = ppFVar10 + -1;
        ppFVar1 = ppFVar7;
      } while (ppFVar7 < ppFVar10);
    }
    this->seen_first_function_body = true;
  }
  ppFVar1 = (this->functions_with_bodies).
            super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->functions_with_bodies).
      super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start == ppFVar1) {
    p_Var8 = ::dxil_spv::get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      parse_function_body();
    }
    else {
      uStack_1028 = 0x7270206f742073;
      builtin_strncpy(acStack_1021,"ocess?\n",8);
      local_1038 = (Type *)0x2065726f6d206f4e;
      uStack_1030 = 0x6f6974636e7566;
      uStack_1029 = 0x6e;
      pvVar9 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var8)(pvVar9,Error,(char *)&local_1038);
    }
  }
  else {
    pFVar2 = ppFVar1[-1];
    this->function = pFVar2;
    (this->functions_with_bodies).
    super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppFVar1 + -1;
    local_1078 = &this->values;
    this_00 = Function::getFunctionType(pFVar2);
    local_107c = 0;
    uVar6 = FunctionType::getNumParams(this_00);
    if (uVar6 != 0) {
      do {
        local_1038 = FunctionType::getParamType(this_00,local_107c);
        arg = LLVMContext::construct<LLVMBC::Argument,LLVMBC::Type*&,unsigned_int&>
                        (this->context,&local_1038,&local_107c);
        Function::add_argument(this->function,arg);
        add_value(this,&arg->super_Value);
        uVar11 = local_107c + 1;
        local_107c = uVar11;
        uVar6 = FunctionType::getNumParams(this_00);
      } while (uVar11 < uVar6);
    }
    pBVar3 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (entry_00 = (entry->children).
                    super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
                    ._M_impl.super__Vector_impl_data._M_start; entry_00 != pBVar3;
        entry_00 = entry_00 + 1) {
      if (entry_00->blockDwordLength == 0) {
        bVar5 = parse_record(this,entry_00);
      }
      else {
        bVar5 = parse_function_child_block(this,entry_00);
      }
      if (bVar5 == false) goto LAB_00184aba;
    }
    bVar5 = resolve_forward_references(this);
    if ((bVar5) && (bVar5 = resolve_global_initializations(this), bVar5)) {
      pFVar2 = this->function;
      local_1058.
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (this->basic_blocks).
           super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1058.
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (this->basic_blocks).
           super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1058.
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (this->basic_blocks).
           super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->basic_blocks).
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->basic_blocks).
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->basic_blocks).
      super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Function::set_basic_blocks(pFVar2,&local_1058);
      if (local_1058.
          super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        ::dxil_spv::free_in_thread
                  (local_1058.
                   super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>>::
      _M_assign_aux<LLVMBC::BasicBlock*const*>
                ((vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>> *)
                 &this->basic_blocks,0,0);
      this->basic_block_index = 0;
      Module::add_function_implementation(this->module,this->function);
      std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::operator=
                (local_1078,&local_1070);
      ppIVar4 = (this->instructions).
                super__Vector_base<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = true;
      if ((this->instructions).
          super__Vector_base<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppIVar4) {
        (this->instructions).
        super__Vector_base<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppIVar4;
      }
      goto LAB_00184abc;
    }
  }
LAB_00184aba:
  bVar5 = false;
LAB_00184abc:
  if (local_1070.
      super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    ::dxil_spv::free_in_thread
              (local_1070.
               super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool ModuleParseContext::parse_function_body(const BlockOrRecord &entry)
{
	auto global_values = values;

	// I think we are supposed to process functions in same order as the module declared them?
	if (!seen_first_function_body)
	{
		std::reverse(functions_with_bodies.begin(), functions_with_bodies.end());
		seen_first_function_body = true;
	}

	if (functions_with_bodies.empty())
	{
		LOGE("No more functions to process?\n");
		return false;
	}

	function = functions_with_bodies.back();
	functions_with_bodies.pop_back();

	auto *func_type = function->getFunctionType();
	for (unsigned i = 0; i < func_type->getNumParams(); i++)
	{
		auto *param_type = func_type->getParamType(i);
		auto *arg = context->construct<Argument>(param_type, i);
		function->add_argument(arg);
		add_value(arg);
	}

	for (auto &child : entry.children)
	{
		if (child.IsBlock())
		{
			if (!parse_function_child_block(child))
				return false;
		}
		else
		{
			if (!parse_record(child))
				return false;
		}
	}

	if (!resolve_forward_references())
		return false;
	if (!resolve_global_initializations())
		return false;

	function->set_basic_blocks(std::move(basic_blocks));
	basic_blocks = {};
	basic_block_index = 0;
	module->add_function_implementation(function);

	values = global_values;
	instructions.clear();
	return true;
}